

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O1

void bitbltsub(LispPTR *argv)

{
  DLword *pDVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  sbyte sVar6;
  bool bVar7;
  bool bVar8;
  LispPTR LVar9;
  bool bVar10;
  ulong uVar11;
  sbyte sVar12;
  int iVar13;
  uint uVar14;
  uint *puVar15;
  long lVar16;
  DLword *pDVar17;
  uint *puVar18;
  uint uVar19;
  int iVar20;
  DLword *pDVar21;
  uint *puVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint *puVar26;
  uint *puVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  DLword grayword [4];
  byte local_135;
  uint local_134;
  uint local_124;
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  DLword *local_110;
  uint local_108;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_d8;
  uint local_d4;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint *local_b0;
  undefined8 local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  uint *local_88;
  ulong local_80;
  int local_78;
  int local_74;
  ulong local_70;
  long local_68;
  ulong local_60;
  DLword *local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_a8 = 0;
  uVar11 = (ulong)*argv;
  if ((*argv & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar11);
  }
  pDVar1 = Lisp_world;
  uVar25 = argv[1];
  if ((uVar25 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar25);
  }
  pDVar17 = Lisp_world + uVar25;
  uVar14 = (uint)(ushort)argv[2];
  LVar9 = argv[3];
  uVar25 = argv[4];
  if ((uVar25 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar25);
  }
  uVar2 = (ushort)argv[5];
  uVar30 = argv[6] & 0xffff;
  local_90 = (ulong)uVar30;
  uVar3 = pDVar1[uVar11 + 9];
  pDVar21 = (DLword *)(ulong)uVar3;
  uVar4 = pDVar1[uVar11 + 8];
  local_a0 = (ulong)uVar4;
  uVar34 = 0x7fffffff;
  bVar7 = true;
  if (uVar3 == 0 || uVar4 == 0) {
    bVar10 = true;
    local_120 = 0;
    bVar8 = true;
    local_70 = 0;
    bVar7 = true;
    goto LAB_0010bbf8;
  }
  pDVar1 = Lisp_world + uVar25;
  uVar25 = (uint)REPLACE_atom;
  if (argv[9] != 0) {
    uVar25 = argv[9];
  }
  uVar19 = (uint)INPUT_atom;
  if (argv[8] != 0) {
    uVar19 = argv[8];
  }
  uVar29 = 1;
  if (uVar25 != ERASE_atom) {
    uVar29 = (uint)(uVar25 == INVERT_atom) * 3;
  }
  local_135 = (uVar25 == ERASE_atom) != (uVar19 == INVERT_atom);
  local_124 = 2;
  if (uVar25 != PAINT_atom) {
    local_124 = uVar29;
  }
  uVar5 = pDVar1[3];
  uVar25 = (uint)uVar5;
  local_11c = uVar25 * 0x10;
  if (uVar19 != TEXTURE_atom) {
    uVar19 = (uint)(ushort)LVar9;
    bVar7 = true;
    if ((((pDVar17 == pDVar1) && (bVar7 = true, uVar19 <= uVar30)) && (uVar30 <= uVar4 + uVar19)) &&
       ((uVar19 != uVar30 ||
        ((bVar7 = true, uVar14 < uVar2 && (bVar7 = true, (uint)uVar2 < uVar3 + uVar14)))))) {
      bVar7 = false;
    }
    uVar29 = (uint)pDVar17[3];
    uVar34 = uVar29 * 0x10;
    if (bVar7) {
      iVar20 = uVar19 * pDVar17[3];
      uVar30 = uVar5 * uVar30 + *(int *)pDVar1;
    }
    else {
      iVar20 = ((uVar4 + uVar19) - 1) * uVar29;
      uVar30 = (uVar4 + uVar30 + -1) * uVar25 + *(int *)pDVar1;
      uVar34 = uVar29 * -0x10;
      local_11c = uVar25 * -0x10;
    }
    local_110 = Lisp_world + (uint)(*(int *)pDVar17 + iVar20);
    pDVar21 = Lisp_world + uVar30;
    local_120 = 0;
    bVar8 = true;
    local_70 = 0;
    bVar10 = false;
    goto LAB_0010bbf8;
  }
  uVar25 = argv[10];
  uVar11 = (ulong)uVar25;
  uVar14 = (int)((uint)uVar2 - (uint)(ushort)argv[0xb]) % 0x10;
  pDVar21 = Lisp_world + (uVar5 * uVar30 + *(int *)pDVar1);
  if (uVar11 == 0) {
LAB_0010bb64:
    local_a8 = (ulong)local_a8._2_6_ << 0x10;
  }
  else {
    uVar19 = argv[0xc];
    if ((*(byte *)(((ulong)(uVar25 >> 8 & 0xffffe) + (long)MDStypetbl ^ 2) + 1) & 0x10) == 0) {
      if ((uVar25 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar11);
        uVar30 = (uint)local_90;
      }
      local_120 = 0x10;
      if ((ushort)*(uint *)(Lisp_world + uVar11 + 2) < 0x10) {
        local_120 = *(uint *)(Lisp_world + uVar11 + 2);
      }
      local_120 = local_120 & 0xffff;
      bVar8 = false;
      local_70 = (ulong)((uVar19 & 0xffff) + uVar30) % (ulong)local_120;
      local_110 = Lisp_world + *(uint *)(Lisp_world + uVar11) + local_70;
      bVar10 = false;
      bVar7 = true;
      goto LAB_0010bbf8;
    }
    if ((ushort)uVar25 != 0xffff) {
      if ((uVar25 & 0xffff) != 0) {
        local_a8 = CONCAT26(((ushort)(uVar25 >> 4) & 0xf) * 0x1111,
                            CONCAT24(((ushort)uVar25 & 0xf) * 0x1111,
                                     CONCAT22((short)((uVar25 & 0xffff) >> 0xc) * 0x1111,
                                              ((ushort)(uVar25 >> 8) & 0xf) * 0x1111)));
        local_70 = (ulong)(uVar19 + argv[6] & 3);
        local_110 = (DLword *)((long)&local_a8 + local_70 * 2);
        bVar10 = false;
        local_120 = 4;
        bVar8 = false;
        goto LAB_0010bbf8;
      }
      goto LAB_0010bb64;
    }
    local_a8 = CONCAT62(local_a8._2_6_,0xffff);
  }
  local_110 = (DLword *)&local_a8;
  bVar10 = false;
  bVar8 = false;
  local_120 = 1;
  local_70 = 0;
LAB_0010bbf8:
  if (!bVar10) {
    ScreenLocked = 1;
    local_108 = (uint)uVar3;
    if (bVar8) {
      local_f0 = uVar34 | local_11c;
      if (bVar7) {
        local_b0 = (uint *)((ulong)(uVar2 >> 3) + (long)pDVar21);
        uVar25 = (uVar2 & 7) + ((uint)local_b0 & 3) * 8;
        local_d4 = (uVar3 + uVar25) - 1 & 0x1f;
        local_100 = -1 << (~(byte)local_d4 & 0x1f);
        local_fc = -(uint)(uVar25 == 0) | ~(-1 << (-(char)uVar25 & 0x1fU));
        if ((int)uVar14 < 0) {
          uVar11 = -(ulong)(7 - uVar14 >> 3);
        }
        else {
          uVar11 = (ulong)(uVar14 >> 3);
        }
        local_d8 = local_100 & local_fc;
        local_ec = (uVar25 + uVar3 >> 5) - 1;
        local_88 = (uint *)(uVar11 + (long)local_110 & 0xfffffffffffffffc);
        uVar14 = (uVar14 & 7) + ((uint)(uVar11 + (long)local_110) & 3) * 8;
        local_80 = (ulong)uVar14;
        local_c4 = (uVar3 + uVar14) - 1 & 0x1f;
        uVar30 = uVar14 - uVar25 & 0x1f;
        local_c8 = uVar25 - uVar14 & 0x1f;
        local_cc = -(uint)(uVar30 == 0) | ~(-1 << (sbyte)uVar30);
      }
      else {
        uVar30 = (uint)uVar3;
        iVar20 = uVar2 + uVar30;
        uVar11 = 0xffffffffffffffff;
        if (iVar20 != 0) {
          uVar11 = (ulong)(iVar20 - 1U >> 3);
        }
        local_b0 = (uint *)(uVar11 + (long)pDVar21);
        local_d4 = (iVar20 - 1U & 7) + ((uint)local_b0 & 3) * 8;
        iVar20 = local_d4 - uVar30;
        uVar25 = iVar20 + 1U & 0x1f;
        local_fc = -1 << (~(byte)local_d4 & 0x1f);
        local_100 = -(uint)(uVar25 == 0) | ~(-1 << (-(char)uVar25 & 0x1fU));
        uVar19 = (local_d4 ^ 0xffffffff) + uVar30;
        local_ec = uVar19 >> 5;
        if ((int)uVar19 < 1) {
          local_ec = 0;
        }
        uVar19 = (uVar14 + uVar30) - 1;
        if ((int)(uVar14 + uVar30) < 1) {
          uVar11 = -(ulong)(8 - (uVar14 + uVar30) >> 3);
        }
        else {
          uVar11 = (ulong)(uVar19 >> 3);
        }
        local_d8 = local_100 & local_fc;
        local_88 = (uint *)(uVar11 + (long)local_110 & 0xfffffffffffffffc);
        local_c4 = (uVar19 & 7) + ((uint)(uVar11 + (long)local_110) & 3) * 8;
        iVar13 = local_c4 - local_108;
        local_80 = (ulong)(iVar13 + 1U & 0x1f);
        local_c8 = iVar20 - iVar13 & 0x1f;
        uVar30 = iVar13 - iVar20 & 0x1f;
        local_cc = ~(-1 << (sbyte)uVar30);
      }
    }
    else {
      local_b0 = (uint *)((ulong)(uVar2 >> 3) + (long)pDVar21);
      uVar25 = (uVar2 & 7) + ((uint)local_b0 & 3) * 8;
      local_d4 = (uVar3 + uVar25) - 1 & 0x1f;
      uVar30 = 0;
      local_100 = -1 << (~(byte)local_d4 & 0x1f);
      local_fc = -(uint)(uVar25 == 0) | ~(-1 << (-(char)uVar25 & 0x1fU));
      local_d8 = local_100 & local_fc;
      local_ec = (uVar25 + uVar3 >> 5) - 1;
      local_80 = (ulong)(uVar14 & 0xf);
      local_cc = 0;
      local_c4 = 0;
      local_f0 = local_11c;
      local_88 = (uint *)0x0;
      local_c8 = 0;
    }
    if ((int)local_a0 != 0) {
      uVar19 = (uint)uVar3;
      iVar20 = 0x21 - uVar19;
      local_74 = 0x20 - uVar19;
      local_b0 = (uint *)((ulong)local_b0 & 0xfffffffffffffffc);
      uVar14 = -(local_135 & 1);
      local_48 = (long)((int)local_11c >> 5);
      local_50 = (ulong)((int)uVar34 >> 5);
      local_40 = (ulong)(uVar19 + 0x1f);
      local_68 = (long)(int)(1 - local_120);
      uVar11 = local_a0 & 0xffffffff;
      uVar29 = 0;
      puVar15 = local_88;
LAB_0010bfed:
      local_78 = (int)uVar11;
      local_134 = local_c8;
      local_e4 = local_d8;
      local_e8 = local_100;
      local_e0 = local_fc;
      local_f8 = local_c4;
      local_114 = local_d4;
      local_118 = local_cc;
      puVar18 = local_b0;
      puVar22 = local_88;
      uVar32 = local_80;
      uVar36 = local_ec;
      uVar35 = uVar25;
      do {
        local_38 = (ulong)local_124;
        uVar31 = (uint)uVar32;
        puVar27 = puVar18;
        uVar24 = local_e4;
        if (bVar8) {
          sVar6 = (sbyte)uVar30;
          sVar12 = (sbyte)local_134;
          if (bVar7) {
            uVar33 = *puVar15;
            if ((uVar35 < uVar31) && (local_74 < (int)uVar31)) {
              puVar26 = puVar15 + 1;
              puVar15 = puVar15 + 2;
              uVar23 = *puVar26 >> sVar12 & local_118 | uVar33 << sVar6;
              uVar29 = ~local_118 & *puVar26 << sVar6;
            }
            else {
              puVar15 = puVar15 + 1;
              if (uVar35 < uVar31) {
                uVar23 = uVar33 << sVar6;
              }
              else {
                uVar23 = uVar33 >> sVar12 & local_118;
                uVar29 = ~local_118 & uVar33 << sVar6;
              }
            }
            uVar23 = uVar23 ^ uVar14;
            if ((int)uVar35 < iVar20) goto LAB_0010ccca;
            uVar24 = *puVar18;
            uVar33 = uVar24;
            switch(local_38) {
            case 0:
              break;
            case 1:
              uVar23 = uVar23 & uVar24;
              break;
            case 2:
              uVar23 = uVar23 | uVar24;
              break;
            case 3:
              uVar23 = uVar23 ^ uVar24;
              break;
            default:
              goto switchD_0010c1fc_default;
            }
            uVar33 = uVar23;
switchD_0010c1fc_default:
            *puVar18 = uVar33 & local_e0 | uVar24 & ~local_e0;
            puVar27 = puVar18 + 1;
            if (uVar31 == uVar35) {
              if ((local_135 & 1) == 0) {
                switch(local_38) {
                case 0:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      uVar24 = *puVar15;
                      puVar15 = puVar15 + 1;
                      *puVar27 = uVar24;
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 & *puVar15;
                      puVar15 = puVar15 + 1;
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 | *puVar15;
                      puVar15 = puVar15 + 1;
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 ^ *puVar15;
                      puVar15 = puVar15 + 1;
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                }
              }
              else {
                switch(local_38) {
                case 0:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      uVar24 = *puVar15;
                      puVar15 = puVar15 + 1;
                      *puVar27 = ~uVar24;
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 & ~*puVar15;
                      puVar15 = puVar15 + 1;
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 | ~*puVar15;
                      puVar15 = puVar15 + 1;
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      uVar24 = *puVar15;
                      puVar15 = puVar15 + 1;
                      *puVar27 = ~(uVar24 ^ *puVar27);
                      puVar27 = puVar27 + 1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                }
              }
            }
            else if ((local_135 & 1) == 0) {
              switch(local_38) {
              case 0:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar23 = uVar24 >> sVar12 | uVar29;
                    uVar29 = uVar24 << sVar6;
                    *puVar27 = uVar23;
                    puVar27 = puVar27 + 1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 1:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  uVar24 = uVar29;
                  do {
                    uVar23 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar29 = uVar23 << sVar6;
                    *puVar27 = *puVar27 & (uVar23 >> sVar12 | uVar24);
                    puVar27 = puVar27 + 1;
                    iVar13 = iVar13 + -1;
                    uVar24 = uVar29;
                  } while (1 < iVar13);
                }
                break;
              case 2:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  puVar26 = puVar27;
                  uVar24 = uVar29;
                  do {
                    uVar23 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar29 = uVar23 << sVar6;
                    puVar27 = puVar26 + 1;
                    *puVar26 = uVar24 | *puVar26 | uVar23 >> sVar12;
                    iVar13 = iVar13 + -1;
                    puVar26 = puVar27;
                    uVar24 = uVar29;
                  } while (1 < iVar13);
                }
                break;
              case 3:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  uVar24 = uVar29;
                  do {
                    uVar23 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar29 = uVar23 << sVar6;
                    *puVar27 = *puVar27 ^ (uVar23 >> sVar12 | uVar24);
                    puVar27 = puVar27 + 1;
                    iVar13 = iVar13 + -1;
                    uVar24 = uVar29;
                  } while (1 < iVar13);
                }
              }
            }
            else {
              switch(local_38) {
              case 0:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar23 = uVar24 >> sVar12 | uVar29;
                    uVar29 = uVar24 << sVar6;
                    *puVar27 = ~uVar23;
                    puVar27 = puVar27 + 1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 1:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar23 = uVar24 >> sVar12 | uVar29;
                    uVar29 = uVar24 << sVar6;
                    *puVar27 = *puVar27 & ~uVar23;
                    puVar27 = puVar27 + 1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 2:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar23 = uVar24 >> sVar12 | uVar29;
                    uVar29 = uVar24 << sVar6;
                    *puVar27 = *puVar27 | ~uVar23;
                    puVar27 = puVar27 + 1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 3:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  puVar26 = puVar27;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + 1;
                    uVar23 = uVar24 >> sVar12 | uVar29;
                    uVar29 = uVar24 << sVar6;
                    puVar27 = puVar26 + 1;
                    *puVar26 = ~(uVar23 ^ *puVar26);
                    iVar13 = iVar13 + -1;
                    puVar26 = puVar27;
                  } while (1 < iVar13);
                }
              }
            }
            local_98 = uVar32;
            if (local_114 == 0x1f) goto LAB_0010cd2a;
            uVar23 = uVar29;
            if (local_f8 <= local_114) {
              uVar24 = *puVar15 >> sVar12 & local_118;
LAB_0010ccbe:
              uVar23 = uVar24 | uVar29;
            }
          }
          else {
            if (local_f8 < local_114) {
              if (uVar35 + 1 < uVar3 + uVar31) {
                puVar26 = puVar15 + -1;
                uVar29 = *puVar15;
                puVar15 = puVar15 + -2;
                uVar23 = *puVar26 << sVar6 | uVar29 >> sVar12 & local_118;
                uVar29 = *puVar26 >> sVar12 & local_118;
              }
              else {
                if (local_114 <= local_f8) goto LAB_0010c225;
                uVar23 = *puVar15;
                puVar15 = puVar15 + -1;
                uVar23 = uVar23 >> sVar12 & local_118;
              }
            }
            else {
LAB_0010c225:
              uVar29 = *puVar15;
              puVar15 = puVar15 + -1;
              uVar23 = uVar29 << sVar6;
              uVar29 = uVar29 >> sVar12 & local_118;
            }
            uVar23 = uVar23 ^ uVar14;
            if ((int)uVar35 < iVar20) goto LAB_0010ccca;
            uVar24 = *puVar18;
            uVar33 = uVar24;
            switch(local_38) {
            case 0:
              break;
            case 1:
              uVar23 = uVar23 & uVar24;
              break;
            case 2:
              uVar23 = uVar23 | uVar24;
              break;
            case 3:
              uVar23 = uVar23 ^ uVar24;
              break;
            default:
              goto switchD_0010c27c_default;
            }
            uVar33 = uVar23;
switchD_0010c27c_default:
            *puVar18 = uVar33 & local_e0 | uVar24 & ~local_e0;
            puVar27 = puVar18 + -1;
            if (uVar31 == uVar35) {
              if ((local_135 & 1) == 0) {
                switch(local_38) {
                case 0:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      uVar24 = *puVar15;
                      puVar15 = puVar15 + -1;
                      *puVar27 = uVar24;
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 & *puVar15;
                      puVar15 = puVar15 + -1;
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 | *puVar15;
                      puVar15 = puVar15 + -1;
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 ^ *puVar15;
                      puVar15 = puVar15 + -1;
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                }
              }
              else {
                switch(local_38) {
                case 0:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      uVar24 = *puVar15;
                      puVar15 = puVar15 + -1;
                      *puVar27 = ~uVar24;
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 1:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 & ~*puVar15;
                      puVar15 = puVar15 + -1;
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 2:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      *puVar27 = *puVar27 | ~*puVar15;
                      puVar15 = puVar15 + -1;
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                  break;
                case 3:
                  if (0 < (int)uVar36) {
                    iVar13 = uVar36 + 1;
                    do {
                      uVar24 = *puVar15;
                      puVar15 = puVar15 + -1;
                      *puVar27 = ~(uVar24 ^ *puVar27);
                      puVar27 = puVar27 + -1;
                      iVar13 = iVar13 + -1;
                    } while (1 < iVar13);
                  }
                }
              }
            }
            else if ((local_135 & 1) == 0) {
              switch(local_38) {
              case 0:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar23 = uVar24 << sVar6 | uVar29;
                    uVar29 = uVar24 >> sVar12;
                    *puVar27 = uVar23;
                    puVar27 = puVar27 + -1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 1:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  uVar24 = uVar29;
                  do {
                    uVar23 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar29 = uVar23 >> sVar12;
                    *puVar27 = *puVar27 & (uVar23 << sVar6 | uVar24);
                    puVar27 = puVar27 + -1;
                    iVar13 = iVar13 + -1;
                    uVar24 = uVar29;
                  } while (1 < iVar13);
                }
                break;
              case 2:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  puVar26 = puVar27;
                  uVar24 = uVar29;
                  do {
                    uVar23 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar29 = uVar23 >> sVar12;
                    puVar27 = puVar26 + -1;
                    *puVar26 = uVar24 | *puVar26 | uVar23 << sVar6;
                    iVar13 = iVar13 + -1;
                    puVar26 = puVar27;
                    uVar24 = uVar29;
                  } while (1 < iVar13);
                }
                break;
              case 3:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  uVar24 = uVar29;
                  do {
                    uVar23 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar29 = uVar23 >> sVar12;
                    *puVar27 = *puVar27 ^ (uVar23 << sVar6 | uVar24);
                    puVar27 = puVar27 + -1;
                    iVar13 = iVar13 + -1;
                    uVar24 = uVar29;
                  } while (1 < iVar13);
                }
              }
            }
            else {
              switch(local_38) {
              case 0:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar23 = uVar24 << sVar6 | uVar29;
                    uVar29 = uVar24 >> sVar12;
                    *puVar27 = ~uVar23;
                    puVar27 = puVar27 + -1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 1:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar23 = uVar24 << sVar6 | uVar29;
                    uVar29 = uVar24 >> sVar12;
                    *puVar27 = *puVar27 & ~uVar23;
                    puVar27 = puVar27 + -1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 2:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar23 = uVar24 << sVar6 | uVar29;
                    uVar29 = uVar24 >> sVar12;
                    *puVar27 = *puVar27 | ~uVar23;
                    puVar27 = puVar27 + -1;
                    iVar13 = iVar13 + -1;
                  } while (1 < iVar13);
                }
                break;
              case 3:
                if (0 < (int)uVar36) {
                  iVar13 = uVar36 + 1;
                  puVar26 = puVar27;
                  do {
                    uVar24 = *puVar15;
                    puVar15 = puVar15 + -1;
                    uVar23 = uVar24 << sVar6 | uVar29;
                    uVar29 = uVar24 >> sVar12;
                    puVar27 = puVar26 + -1;
                    *puVar26 = ~(uVar23 ^ *puVar26);
                    iVar13 = iVar13 + -1;
                    puVar26 = puVar27;
                  } while (1 < iVar13);
                }
              }
            }
            local_98 = uVar32;
            if (uVar35 == 0) goto LAB_0010cd2a;
            uVar23 = uVar29;
            if (uVar35 <= uVar31) {
              uVar24 = *puVar15 << sVar6;
              goto LAB_0010ccbe;
            }
          }
          uVar23 = uVar23 ^ uVar14;
          uVar24 = local_e8;
          local_98 = uVar32;
LAB_0010ccca:
          uVar33 = *puVar27;
          uVar37 = uVar33;
          switch(local_38) {
          case 0:
            break;
          case 1:
            uVar23 = uVar23 & uVar33;
            break;
          case 2:
            uVar23 = uVar23 | uVar33;
            break;
          case 3:
            uVar23 = uVar23 ^ uVar33;
            break;
          default:
            goto switchD_0010ccf9_default;
          }
          uVar37 = uVar23;
switchD_0010ccf9_default:
          *puVar27 = uVar33 & ~uVar24 | uVar37 & uVar24;
        }
        else {
          uVar30 = uVar31 - uVar35 & 0xf;
          uVar23 = CONCAT22(*local_110,*local_110) << (sbyte)uVar30;
          uVar23 = (uVar23 >> 0x10 | uVar23) ^ uVar14;
          if ((int)uVar35 < iVar20) goto LAB_0010ccca;
          uVar24 = *puVar18;
          uVar33 = uVar24;
          switch(local_38) {
          case 0:
            uVar33 = uVar23;
            break;
          case 1:
            uVar33 = uVar24 & uVar23;
            break;
          case 2:
            uVar33 = uVar24 | uVar23;
            break;
          case 3:
            uVar33 = uVar24 ^ uVar23;
          }
          *puVar18 = uVar33 & local_e0 | uVar24 & ~local_e0;
          puVar27 = puVar18 + 1;
          switch(local_38) {
          case 0:
            if (0 < (int)uVar36) {
              iVar13 = uVar36 + 1;
              do {
                *puVar27 = uVar23;
                puVar27 = puVar27 + 1;
                iVar13 = iVar13 + -1;
              } while (1 < iVar13);
            }
            break;
          case 1:
            if (0 < (int)uVar36) {
              iVar13 = uVar36 + 1;
              do {
                *puVar27 = *puVar27 & uVar23;
                puVar27 = puVar27 + 1;
                iVar13 = iVar13 + -1;
              } while (1 < iVar13);
            }
            break;
          case 2:
            if (0 < (int)uVar36) {
              iVar13 = uVar36 + 1;
              do {
                *puVar27 = *puVar27 | uVar23;
                puVar27 = puVar27 + 1;
                iVar13 = iVar13 + -1;
              } while (1 < iVar13);
            }
            break;
          case 3:
            if (0 < (int)uVar36) {
              iVar13 = uVar36 + 1;
              do {
                *puVar27 = *puVar27 ^ uVar23;
                puVar27 = puVar27 + 1;
                iVar13 = iVar13 + -1;
              } while (1 < iVar13);
            }
          }
          uVar24 = local_e8;
          if (local_114 != 0x1f) goto LAB_0010ccca;
        }
LAB_0010cd2a:
        iVar13 = (int)uVar11;
        uVar11 = (ulong)(iVar13 - 1);
        if (!bVar8) goto LAB_0010cfb2;
        if (bVar7) {
          uVar24 = local_11c;
          if ((local_f0 & 0x1f) != 0) {
            uVar24 = uVar35 + local_11c;
            uVar35 = uVar24 & 0x1f;
            local_114 = (uVar35 + uVar3) - 1 & 0x1f;
            local_e0 = -(uint)(uVar35 == 0) | ~(-1 << (-(char)uVar35 & 0x1fU));
            local_e8 = -1 << (~(byte)local_114 & 0x1f);
            local_e4 = local_e8 & local_e0;
            uVar36 = (uVar35 + uVar3 >> 5) - 1;
          }
          uVar23 = uVar34;
          if ((local_f0 & 0x1f) != 0) {
            uVar23 = uVar31 + uVar34;
            uVar32 = (ulong)(uVar23 & 0x1f);
            local_f8 = uVar19 + 0x1f + uVar23 & 0x1f;
            uVar30 = uVar23 - uVar35 & 0x1f;
            local_134 = uVar35 - uVar23 & 0x1f;
            local_118 = -(uint)(uVar30 == 0) | ~(-1 << (sbyte)uVar30);
          }
          lVar16 = (long)((int)uVar24 >> 5);
          uVar28 = (long)((int)uVar23 >> 5);
        }
        else {
          lVar16 = local_48;
          if ((local_f0 & 0x1f) != 0) {
            uVar36 = local_114 + local_11c;
            lVar16 = -(ulong)(0x1f - uVar36 >> 5);
            if (-1 < (int)uVar36) {
              lVar16 = 0;
            }
            local_114 = uVar36 & 0x1f;
            local_e0 = -1 << (~(byte)local_114 & 0x1f);
            uVar35 = (uVar36 - uVar3) + 1 & 0x1f;
            local_e8 = -(uint)(uVar35 == 0) | ~(-1 << (-(char)uVar35 & 0x1fU));
            local_e4 = local_e8 & local_e0;
            uVar24 = (local_114 ^ 0xffffffff) + (uint)uVar3;
            uVar36 = uVar24 >> 5;
            if ((int)uVar24 < 1) {
              uVar36 = 0;
            }
          }
          uVar28 = local_50;
          if ((local_f0 & 0x1f) != 0) {
            uVar30 = local_f8 + uVar34;
            uVar28 = (ulong)(uVar30 >> 5);
            if ((int)uVar30 < 0) {
              uVar28 = -(ulong)(0x1f - uVar30 >> 5);
            }
            local_f8 = uVar30 & 0x1f;
            uVar24 = (uVar30 - local_108) + 1;
            uVar32 = (ulong)(uVar24 & 0x1f);
            uVar30 = uVar24 - uVar35 & 0x1f;
            local_134 = uVar35 - uVar24 & 0x1f;
            local_118 = ~(-1 << (sbyte)uVar30);
          }
        }
        puVar18 = puVar18 + lVar16;
        puVar15 = puVar22 + uVar28;
        puVar22 = puVar15;
        if (iVar13 < 2) break;
      } while( true );
    }
LAB_0010d09c:
    if ((DisplayRegion68k <= pDVar21) && (pDVar21 <= DISP_MAX_Address)) {
      local_60 = (ulong)uVar2;
      local_58 = pDVar21;
      flush_display_region((uint)uVar2,(int)local_90,(uint)uVar3,(int)local_a0);
    }
    ScreenLocked = 0;
  }
  return;
LAB_0010cfb2:
  uVar36 = local_11c;
  if ((local_f0 & 0x1f) != 0) {
    uVar36 = uVar25 + local_11c;
    uVar25 = uVar36 & 0x1f;
    local_d4 = (uVar25 + uVar3) - 1 & 0x1f;
    local_fc = -(uint)(uVar25 == 0) | ~(-1 << (-(char)uVar25 & 0x1fU));
    local_100 = -1 << (~(byte)local_d4 & 0x1f);
    local_d8 = local_100 & local_fc;
    local_ec = (uVar25 + uVar3 >> 5) - 1;
  }
  uVar35 = (int)local_70 + 1;
  pDVar1 = local_110 + 1;
  local_110 = local_110 + local_68;
  if ((int)uVar35 < (int)local_120) {
    local_110 = pDVar1;
  }
  local_b0 = local_b0 + ((int)uVar36 >> 5);
  if ((int)local_120 <= (int)uVar35) {
    uVar35 = 0;
  }
  local_70 = (ulong)uVar35;
  if (local_78 < 2) goto LAB_0010d09c;
  goto LAB_0010bfed;
}

Assistant:

void bitbltsub(LispPTR *argv) {
  int sourcetype, operation;
  int sty, dty, texture, wxoffset, wyoffset;
  int h, w;
#ifdef REALCURSOR
  int displayflg = 0;
#endif
  int backwardflg = 0, sx, dx, srcbpl=2147483647, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0, num_gray = 0, curr_gray_line = 0;
  DLword grayword[4] = {0, 0, 0, 0};

  { /* Initialization code, in a block so it optimizes independently */
    LispPTR *args = argv;
    PILOTBBT *pbt;
    BITMAP *srcebm, *destbm;
    BITMAP *texture68k;
    DLword *base;

#ifdef INIT
    init_kbd_startup;
#endif

    pbt = (PILOTBBT *)NativeAligned4FromLAddr(args[0]);
    srcebm = (BITMAP *)NativeAligned4FromLAddr(args[1]);
    sx = (args[2] & 0xFFFF);
    sty = (args[3] & 0xFFFF);
    destbm = (BITMAP *)NativeAligned4FromLAddr(args[4]);
    dx = (args[5] & 0xFFFF);
    dty = (args[6] & 0xFFFF);
    sourcetype = (args[8] == NIL_PTR ? INPUT_atom : args[8]);
    operation = (args[9] == NIL_PTR ? REPLACE_atom : args[9]);

    w = pbt->pbtwidth;
    h = pbt->pbtheight;
    if ((h <= 0) || (w <= 0)) return;
    src_comp = bbsrc_type(sourcetype, operation);
    op = bbop(sourcetype, operation);

    dstbpl = destbm->bmrasterwidth << 4;

    if (sourcetype == TEXTURE_atom) {
      texture = args[10];
      wxoffset = (args[11] == NIL_PTR ? 0 : args[11] & 0xFFFF);
      wyoffset = (args[12] == NIL_PTR ? 0 : args[12] & 0xFFFF);
      sx = ((wxoffset) ? (dx - wxoffset) : dx) % BITSPERWORD;
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
      gray = 1;
      if (texture == NIL_PTR) { /* White Shade */
        grayword[0] = 0;
        srcbase = &grayword[0];
        num_gray = 1;
        curr_gray_line = 0;
        goto do_it_now;
      } else if (IsNumber(texture)) {
        if ((texture &= 0xffff) == 0) { /* White Shade */
          grayword[0] = 0;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else if (texture == 0xffff) { /* Black Shade */
          grayword[0] = 0xFFFF;
          srcbase = &grayword[0];
          num_gray = 1;
          curr_gray_line = 0;
          goto do_it_now;
        } else { /* 4x4 */
          srcbase = base = (DLword *)(&grayword[0]);
          GETWORD(base++) = Expand4Bit(((texture >> 12) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 8) & 0xf));
          GETWORD(base++) = Expand4Bit(((texture >> 4) & 0xf));
          GETWORD(base++) = Expand4Bit((texture & 0xf));
          num_gray = 4;
          curr_gray_line = (dty + wyoffset) & 3;
          srcbase += curr_gray_line;
          goto do_it_now;
        }
      } else { /* A bitmap that is 16 bits wide. */
        texture68k = (BITMAP *)NativeAligned4FromLAddr(texture);
        srcbase = (DLword *)NativeAligned2FromLAddr(texture68k->bmbase);
        num_gray = min(texture68k->bmheight, 16);
        curr_gray_line = (dty + wyoffset) % num_gray;
        srcbase += curr_gray_line;
        goto do_it_now;
      }
    }
    /* ; INPUT or INVERT      */
    srcbpl = srcebm->bmrasterwidth << 4;

    /* compute flags */
    /* out for now
    if(srcebm == destbm)
    if(sty <= dty)
    if(dty <= (sty + h))
    if((sty != dty) || ((sx < dx) && (dx < (sx + w))))
                      backwardflg = T;
    out for now */
    /* compute flags */
    if (srcebm != destbm)
      ;
    else if (sty > dty)
      ;
    else if (dty > (sty + h))
      ;
    else if ((sty != dty) || ((sx < dx) && (dx < (sx + w))))
      backwardflg = T;

    if (backwardflg) {
      srcbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * (sty + h - 1)));
      dstbase = (DLword *)NativeAligned2FromLAddr(
          ADDBASE(destbm->bmbase, destbm->bmrasterwidth * (dty + h - 1)));
      srcbpl = 0 - srcbpl;
      dstbpl = 0 - dstbpl;
    } else {
      srcbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(srcebm->bmbase, srcebm->bmrasterwidth * sty));
      dstbase = (DLword *)NativeAligned2FromLAddr(ADDBASE(destbm->bmbase, destbm->bmrasterwidth * dty));
    }
#ifdef REALCURSOR
    displayflg = n_new_cursorin(srcbase, sx, sty, w, h);
#endif /* REALCURSOR */
  }

do_it_now:
#ifdef DOS
  currentdsp->device.locked++;
#else
  ScreenLocked = T;
#endif /* DOS */

#ifdef REALCURSOR
  displayflg |= n_new_cursorin(dstbase, dx, dty, w, h);
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    /* Copy the changed section of display bank to the frame buffer */
    if (in_display_segment(dstbase)) {
      /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
      flush_display_region(dx, dty, w, h);
    }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_region(dx, dty, w, h);
#endif /* XWINDOW */

#ifdef DOS
  /* Copy the changed section of display bank to the frame buffer */
  if (in_display_segment(dstbase)) {
    /*      DBPRINT(("bltsub: x %d, y %d, w %d, h %d.\n",dx, dty, w,h)); */
    flush_display_region(dx, dty, w, h);
  }
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

#ifdef DOS
  currentdsp->device.locked--;
#else
  ScreenLocked = NIL;
#endif /* DOS */

}